

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O2

char * curl_easy_escape(Curl_easy *data,char *string,int inlength)

{
  byte in_00;
  _Bool _Var1;
  CURLcode CVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  uchar in;
  dynbuf d;
  
  if (inlength < 0) {
    return (char *)0x0;
  }
  Curl_dyn_init(&d,24000000);
  if (inlength == 0) {
    sVar3 = strlen(string);
    if (sVar3 == 0) {
      pcVar4 = (*Curl_cstrdup)("");
      return pcVar4;
    }
  }
  else {
    sVar3 = (size_t)(uint)inlength;
  }
  sVar5 = 0;
  while( true ) {
    if (sVar3 == sVar5) {
      pcVar4 = Curl_dyn_ptr(&d);
      return pcVar4;
    }
    in_00 = string[sVar5];
    in = in_00;
    _Var1 = Curl_isunreserved(in_00);
    if (_Var1) {
      CVar2 = Curl_dyn_addn(&d,&in,1);
    }
    else {
      CVar2 = Curl_dyn_addf(&d,"%%%02X",(ulong)in_00);
    }
    if (CVar2 != CURLE_OK) break;
    sVar5 = sVar5 + 1;
  }
  return (char *)0x0;
}

Assistant:

char *curl_easy_escape(struct Curl_easy *data, const char *string,
                       int inlength)
{
  size_t length;
  struct dynbuf d;
  (void)data;

  if(inlength < 0)
    return NULL;

  Curl_dyn_init(&d, CURL_MAX_INPUT_LENGTH * 3);

  length = (inlength?(size_t)inlength:strlen(string));
  if(!length)
    return strdup("");

  while(length--) {
    unsigned char in = *string; /* we need to treat the characters unsigned */

    if(Curl_isunreserved(in)) {
      /* append this */
      if(Curl_dyn_addn(&d, &in, 1))
        return NULL;
    }
    else {
      /* encode it */
      if(Curl_dyn_addf(&d, "%%%02X", in))
        return NULL;
    }
    string++;
  }

  return Curl_dyn_ptr(&d);
}